

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  bool bVar1;
  ostream *poVar2;
  string local_68;
  string local_38;
  Value *local_18;
  Value *root_local;
  StyledStreamWriter *this_local;
  
  local_18 = root;
  root_local = (Value *)this;
  bVar1 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar1) {
    poVar2 = std::operator<<(this->document_,' ');
    Value::getComment_abi_cxx11_(&local_38,local_18,commentAfterOnSameLine);
    std::operator<<(poVar2,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Value::hasComment(local_18,commentAfter);
  if (bVar1) {
    writeIndent(this);
    poVar2 = this->document_;
    Value::getComment_abi_cxx11_(&local_68,local_18,commentAfter);
    std::operator<<(poVar2,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}